

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hint_source.cpp
# Opt level: O3

HintSource *
HintSource::from_json
          (Json *json,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
          *nodes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  value_t vVar3;
  _Alloc_hider __nptr;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Position PVar7;
  const_reference pvVar8;
  mapped_type *ppWVar9;
  int *piVar11;
  long lVar12;
  HintSource *this;
  uint8_t orientation;
  string orientation_str;
  ushort local_142;
  key_type local_140;
  string node_id;
  unsigned_short ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> map_ids;
  WorldNode *local_c0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> text_ids;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_a0;
  string local_88;
  string description;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  ulong uVar10;
  
  node_id._M_dataplus._M_p = (pointer)&node_id.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&node_id,"description","");
  pvVar8 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&node_id);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&description,pvVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)node_id._M_dataplus._M_p != &node_id.field_2) {
    operator_delete(node_id._M_dataplus._M_p,node_id.field_2._M_allocated_capacity + 1);
  }
  text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[8],_0>(json,(char (*) [8])"textIds");
  if (bVar4) {
    node_id._M_dataplus._M_p = (pointer)&node_id.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&node_id,"textIds","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&node_id);
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
              (pvVar8,&text_ids);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)node_id._M_dataplus._M_p != &node_id.field_2) {
      operator_delete(node_id._M_dataplus._M_p,node_id.field_2._M_allocated_capacity + 1);
    }
  }
  node_id._M_dataplus._M_p = (pointer)&node_id.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&node_id,"smallTextbox","");
  orientation_str._M_dataplus._M_p = orientation_str._M_dataplus._M_p & 0xffffffffffffff00;
  bVar4 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::value<bool,_0>(json,&node_id,(bool *)&orientation_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)node_id._M_dataplus._M_p != &node_id.field_2) {
    operator_delete(node_id._M_dataplus._M_p,node_id.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &orientation_str.field_2;
  orientation_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&orientation_str,"nodeId","");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::value(&node_id,json,&orientation_str,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)orientation_str._M_dataplus._M_p != paVar1) {
    operator_delete(orientation_str._M_dataplus._M_p,
                    orientation_str.field_2._M_allocated_capacity + 1);
  }
  if (node_id._M_string_length == 0) {
    local_c0 = (WorldNode *)0x0;
  }
  else {
    ppWVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
              ::at(nodes,&node_id);
    local_c0 = *ppWVar9;
  }
  map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(json,(char (*) [7])0x215beb);
  if (bVar5) {
    orientation_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&orientation_str,"entity","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&orientation_str);
    paVar2 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mapId","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar8,&local_140);
    vVar3 = pvVar8->m_type;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)orientation_str._M_dataplus._M_p != paVar1) {
      operator_delete(orientation_str._M_dataplus._M_p,
                      orientation_str.field_2._M_allocated_capacity + 1);
    }
    if (vVar3 == array) {
      orientation_str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&orientation_str,"entity","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,&orientation_str);
      local_140._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mapId","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pvVar8,&local_140);
      nlohmann::detail::
      from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
                (pvVar8,&map_ids);
    }
    else {
      orientation_str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&orientation_str,"entity","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(json,&orientation_str);
      local_140._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mapId","");
      pvVar8 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pvVar8,&local_140);
      _ret = _ret & 0xffffffffffff0000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
                (pvVar8,&ret);
      local_142 = ret;
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_assign_aux<unsigned_short_const*>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)&map_ids,&local_142);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)orientation_str._M_dataplus._M_p != paVar1) {
      operator_delete(orientation_str._M_dataplus._M_p,
                      orientation_str.field_2._M_allocated_capacity + 1);
    }
    orientation_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&orientation_str,"entity","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&orientation_str);
    local_140._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"position","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar8,&local_140);
    PVar7 = Position::from_json(pvVar8);
    uVar10 = (ulong)(uint6)PVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)orientation_str._M_dataplus._M_p != paVar1) {
      operator_delete(orientation_str._M_dataplus._M_p,
                      orientation_str.field_2._M_allocated_capacity + 1);
    }
    local_140._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"entity","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_140);
    _ret = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"orientation","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pvVar8,(key_type *)&ret);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&orientation_str,pvVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ret != &local_e8) {
      operator_delete(_ret,local_e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&orientation_str,"sw");
    if (iVar6 == 0) {
      lVar12 = 2;
    }
    else {
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&orientation_str,"se");
      if (iVar6 == 0) {
        lVar12 = 1;
      }
      else {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&orientation_str,"ne");
        if (iVar6 == 0) {
          lVar12 = 0;
        }
        else {
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&orientation_str,"nw");
          __nptr = orientation_str._M_dataplus;
          if (iVar6 == 0) {
            lVar12 = 3;
          }
          else {
            piVar11 = __errno_location();
            iVar6 = *piVar11;
            *piVar11 = 0;
            lVar12 = strtol(__nptr._M_p,(char **)&local_140,10);
            if (local_140._M_dataplus._M_p == __nptr._M_p) {
              std::__throw_invalid_argument("stoi");
LAB_0012770e:
              std::__throw_out_of_range("stoi");
            }
            if (((int)lVar12 != lVar12) || (*piVar11 == 0x22)) goto LAB_0012770e;
            if (*piVar11 == 0) {
              *piVar11 = iVar6;
            }
          }
        }
      }
    }
    orientation = (uint8_t)lVar12;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"entity","");
    pvVar8 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_140);
    _ret = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"highPalette","");
    local_142 = local_142 & 0xff00;
    bVar5 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::value<bool,_0>(pvVar8,(key_type *)&ret,(bool *)&local_142);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ret != &local_e8) {
      operator_delete(_ret,local_e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)orientation_str._M_dataplus._M_p != &orientation_str.field_2) {
      operator_delete(orientation_str._M_dataplus._M_p,
                      orientation_str.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    uVar10 = 0;
    bVar5 = false;
    orientation = '\0';
  }
  this = (HintSource *)operator_new(0x90);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_a0,&text_ids);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,description._M_dataplus._M_p,
             description._M_dataplus._M_p + description._M_string_length);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_48,&map_ids);
  HintSource(this,&local_a0,&local_88,local_c0,bVar4,&local_48,SUB86(uVar10,0),orientation,bVar5);
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_a0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(map_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)map_ids.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)map_ids.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)node_id._M_dataplus._M_p != &node_id.field_2) {
    operator_delete(node_id._M_dataplus._M_p,node_id.field_2._M_allocated_capacity + 1);
  }
  if (text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(text_ids.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)text_ids.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)text_ids.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)description._M_dataplus._M_p != &description.field_2) {
    operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

HintSource* HintSource::from_json(const Json& json, const std::map<std::string, WorldNode*>& nodes)
{
    std::string description = json.at("description");

    std::vector<uint16_t> text_ids;
    if(json.contains("textIds"))
        json.at("textIds").get_to(text_ids);

    bool small_textbox = json.value("smallTextbox", false);

    WorldNode* node = nullptr;
    std::string node_id = json.value("nodeId", "");
    if(!node_id.empty())
        node = nodes.at(node_id);

    std::vector<uint16_t> map_ids;
    Position position;
    uint8_t orientation = 0;
    bool high_palette = false;
    if(json.contains("entity"))
    {
        if(json.at("entity").at("mapId").is_array())
            json.at("entity").at("mapId").get_to(map_ids);
        else
            map_ids = { json.at("entity").at("mapId") };

        position = Position::from_json(json.at("entity").at("position"));

        std::string orientation_str = json.at("entity").at("orientation");
        if(orientation_str == "sw")
            orientation = ENTITY_ORIENTATION_SW;
        else if(orientation_str == "se")
            orientation = ENTITY_ORIENTATION_SE;
        else if(orientation_str == "ne")
            orientation = ENTITY_ORIENTATION_NE;
        else if(orientation_str == "nw")
            orientation = ENTITY_ORIENTATION_NW;
        else
            orientation = std::stoi(orientation_str);

        high_palette = json.at("entity").value("highPalette", false);
    }

    return new HintSource(text_ids, description, node, small_textbox, map_ids, position, orientation, high_palette);
}